

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O0

bool xemmai::t_signature<unsigned_long,unsigned_long>::f_match<0ul,1ul>(t_pointer *a_stack)

{
  bool bVar1;
  t_object *ptVar2;
  bool local_19;
  t_pvalue *a_stack_local;
  
  ptVar2 = t_pointer::operator_cast_to_t_object_(a_stack);
  bVar1 = f_is<unsigned_long>(ptVar2);
  local_19 = false;
  if (bVar1) {
    ptVar2 = t_pointer::operator_cast_to_t_object_(a_stack + 2);
    local_19 = f_is<unsigned_long>(ptVar2);
  }
  return local_19;
}

Assistant:

static bool f_match(t_pvalue* a_stack, std::index_sequence<A_i...>)
	{
		return (f_is<T_an>(a_stack[A_i]) && ...);
	}